

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  VendorIo *io;
  SimpleVendor vendor;
  SimpleVendor SStack_28;
  
  io = (VendorIo *)operator_new(0x18);
  *(undefined ***)io = &PTR_PrintErrorMessage_00104d28;
  *(undefined8 **)(io + 8) = &std::cout;
  *(undefined8 **)(io + 0x10) = &std::cin;
  SimpleVendor::SimpleVendor(&SStack_28,argc,argv,io);
  SimpleVendor::Vend(&SStack_28);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    try {
        SimpleVendor vendor(argc, argv);
        vendor.Vend();
    } catch (invalid_argument e) {
        return 1;
    }
    return 0;
}